

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::printBuffers(Uniforms *this)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  UniformFunctionsMap *this_00;
  size_t i;
  ulong uVar4;
  allocator local_51;
  key_type local_50;
  
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->buffers).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->buffers).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_buffer");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,";");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->doubleBuffers).
                            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->doubleBuffers).
                            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_doubleBuffer");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,";");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->pyramids).
                             super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->pyramids).
                            super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x580); uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_pyramid");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,";");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&local_50,"u_scene",&local_51);
  this_00 = &this->functions;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar1 = pmVar3->present;
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1 == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_scene;");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&local_50,"u_sceneDepth",&local_51);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar1 = pmVar3->present;
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1 == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneDepth;");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&local_50,"u_scenePosition",&local_51);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar1 = pmVar3->present;
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1 == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_scenePosition;");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::string((string *)&local_50,"u_sceneNormal",&local_51);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformFunction>_>_>
           ::operator[](this_00,&local_50);
  bVar1 = pmVar3->present;
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1 == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneNormal;");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void Uniforms::printBuffers() {
    for (size_t i = 0; i < buffers.size(); i++)
        std::cout << "uniform sampler2D u_buffer" << i << ";" << std::endl;

    for (size_t i = 0; i < doubleBuffers.size(); i++)
        std::cout << "uniform sampler2D u_doubleBuffer" << i << ";" << std::endl;

    for (size_t i = 0; i < pyramids.size(); i++)
        std::cout << "uniform sampler2D u_pyramid" << i << ";" << std::endl;  

    if (functions["u_scene"].present)
        std::cout << "uniform sampler2D u_scene;" << std::endl;

    if (functions["u_sceneDepth"].present)
        std::cout << "uniform sampler2D u_sceneDepth;" << std::endl;

    if (functions["u_scenePosition"].present)
        std::cout << "uniform sampler2D u_scenePosition;" << std::endl;

    if (functions["u_sceneNormal"].present)
        std::cout << "uniform sampler2D u_sceneNormal;" << std::endl;
}